

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubByteTypes.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
MILBlob::PackSubByteVecForNonByteAligned<MILBlob::UInt6>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          MILBlob *this,Span<const_unsigned_char,_18446744073709551615UL> span)

{
  uchar uVar1;
  byte bVar2;
  ulong uVar3;
  size_t sVar4;
  byte *pbVar5;
  range_error *this_00;
  reference puVar6;
  byte bVar7;
  IndexAndOffset IVar8;
  uint8_t rshift;
  uint8_t offset;
  uint64_t idx;
  IndexAndOffset indexAndOffset;
  string local_160;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ulong local_40;
  uint64_t i;
  allocator<unsigned_char> local_23;
  value_type_conflict1 local_22 [2];
  undefined1 local_20 [8];
  Span<const_unsigned_char,_18446744073709551615UL> span_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  
  span_local.m_ptr = span.m_ptr;
  local_22[1] = 0;
  local_20 = (undefined1  [8])this;
  span_local.m_size.m_size = (size_t)__return_storage_ptr__;
  sVar4 = Util::Span<const_unsigned_char,_18446744073709551615UL>::Size
                    ((Span<const_unsigned_char,_18446744073709551615UL> *)local_20);
  sVar4 = SizeInBytes<MILBlob::UInt6>(sVar4);
  local_22[0] = '\0';
  std::allocator<unsigned_char>::allocator(&local_23);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,sVar4,local_22,&local_23);
  std::allocator<unsigned_char>::~allocator(&local_23);
  local_40 = 0;
  while( true ) {
    uVar3 = local_40;
    sVar4 = Util::Span<const_unsigned_char,_18446744073709551615UL>::Size
                      ((Span<const_unsigned_char,_18446744073709551615UL> *)local_20);
    if (sVar4 <= uVar3) {
      return __return_storage_ptr__;
    }
    pbVar5 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                       ((Span<const_unsigned_char,_18446744073709551615UL> *)local_20,local_40);
    if (0x3f < *pbVar5) break;
    Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
              ((Span<const_unsigned_char,_18446744073709551615UL> *)local_20,local_40);
    IVar8 = GetIndexAndOffsetForSubByteValue(local_40,'\x06');
    bVar7 = IVar8.offset;
    puVar6 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                       ((Span<const_unsigned_char,_18446744073709551615UL> *)local_20,local_40);
    uVar1 = *puVar6;
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,IVar8.index);
    *pbVar5 = *pbVar5 | uVar1 << (bVar7 & 0x1f);
    if (2 < bVar7) {
      pbVar5 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                         ((Span<const_unsigned_char,_18446744073709551615UL> *)local_20,local_40);
      bVar2 = *pbVar5;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (__return_storage_ptr__,IVar8.index + 1);
      *pbVar5 = *pbVar5 | (byte)((int)(uint)bVar2 >> (8 - bVar7 & 0x1f));
    }
    local_40 = local_40 + 1;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  pbVar5 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                     ((Span<const_unsigned_char,_18446744073709551615UL> *)local_20,local_40);
  std::__cxx11::to_string(&local_120,(uint)*pbVar5);
  std::operator+(&local_100,"Value ",&local_120);
  std::operator+(&local_e0,&local_100," is outside allowed subbyte datatype range [");
  std::__cxx11::to_string(&local_140,0);
  std::operator+(&local_c0,&local_e0,&local_140);
  std::operator+(&local_a0,&local_c0,", ");
  std::__cxx11::to_string(&local_160,0x3f);
  std::operator+(&local_80,&local_a0,&local_160);
  std::operator+(&local_60,&local_80,"].");
  std::range_error::range_error(this_00,(string *)&local_60);
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

std::vector<uint8_t> PackSubByteVecForNonByteAligned(Util::Span<const decltype(T::data)> span)
{
    std::vector<uint8_t> ret(MILBlob::SizeInBytes<T>(span.Size()), 0);

    for (uint64_t i = 0; i < span.Size(); i++) {
        MILVerifyIsTrue(span[i] <= T::MAX && span[i] >= T::MIN,
                        std::range_error,
                        "Value " + std::to_string(span[i]) + " is outside allowed subbyte datatype range [" +
                            std::to_string(T::MIN) + ", " + std::to_string(T::MAX) + "].");

        auto indexAndOffset = GetIndexAndOffsetForSubByteValue(i, T::SizeInBits);
        auto idx = indexAndOffset.index;
        auto offset = indexAndOffset.offset;

        ret[idx] |= ((uint8_t)(span[i] << offset));
        if (offset > 8 - T::SizeInBits) {
            // part of the i'th element of span spills over to idx+1
            // uint8_t rshift = T::SizeInBits - (8 - offset);
            uint8_t rshift = 8 - offset;
            ret[idx + 1] |= ((uint8_t)span[i] >> rshift);
        }
    }

    return ret;
}